

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

WriteBatch * __thiscall leveldb::DBImpl::BuildBatchGroup(DBImpl *this,Writer **last_writer)

{
  long lVar1;
  value_type pWVar2;
  bool bVar3;
  int iVar4;
  reference ppWVar5;
  reference ppWVar6;
  size_t sVar7;
  long *in_RSI;
  _Self *in_RDI;
  long in_FS_OFFSET;
  Writer *w;
  size_t max_size;
  size_t size;
  WriteBatch *result;
  Writer *first;
  iterator iter;
  _Deque_iterator<leveldb::DBImpl::Writer_*,_leveldb::DBImpl::Writer_*&,_leveldb::DBImpl::Writer_**>
  *in_stack_ffffffffffffff68;
  _Self *in_stack_ffffffffffffff70;
  Writer *src;
  Elf64_Ehdr *dst;
  Elf64_Ehdr *local_70;
  WriteBatch *local_68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  port::Mutex::AssertHeld((Mutex *)in_stack_ffffffffffffff68);
  bVar3 = std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::empty
                    ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_> *
                     )in_stack_ffffffffffffff68);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    __assert_fail("!writers_.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,0x4f9,"WriteBatch *leveldb::DBImpl::BuildBatchGroup(Writer **)");
  }
  ppWVar5 = std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::front
                      ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
                        *)in_RDI);
  pWVar2 = *ppWVar5;
  local_68 = pWVar2->batch;
  if (local_68 == (WriteBatch *)0x0) {
    __assert_fail("result != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,0x4fc,"WriteBatch *leveldb::DBImpl::BuildBatchGroup(Writer **)");
  }
  local_70 = (Elf64_Ehdr *)WriteBatchInternal::ByteSize((WriteBatch *)in_stack_ffffffffffffff68);
  dst = &std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
         _S_copy_chars;
  if (local_70 < (Elf64_Ehdr *)0x20001) {
    dst = local_70 + 0x800;
  }
  *in_RSI = (long)pWVar2;
  std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::begin
            ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_> *)
             in_stack_ffffffffffffff70);
  std::
  _Deque_iterator<leveldb::DBImpl::Writer_*,_leveldb::DBImpl::Writer_*&,_leveldb::DBImpl::Writer_**>
  ::operator++(in_stack_ffffffffffffff68);
  while( true ) {
    std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::end
              ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_> *)
               in_stack_ffffffffffffff70);
    bVar3 = std::operator==(in_RDI,in_stack_ffffffffffffff70);
    if (((bVar3 ^ 0xffU) & 1) == 0) break;
    ppWVar6 = std::
              _Deque_iterator<leveldb::DBImpl::Writer_*,_leveldb::DBImpl::Writer_*&,_leveldb::DBImpl::Writer_**>
              ::operator*(in_stack_ffffffffffffff68);
    src = *ppWVar6;
    if (((src->sync & 1U) != 0) && ((pWVar2->sync & 1U) == 0)) break;
    if (src->batch != (WriteBatch *)0x0) {
      sVar7 = WriteBatchInternal::ByteSize((WriteBatch *)in_stack_ffffffffffffff68);
      local_70 = (Elf64_Ehdr *)(&local_70->e_ident_magic_num + sVar7);
      if (dst < local_70) break;
      if (local_68 == pWVar2->batch) {
        local_68 = (WriteBatch *)in_RDI[0xd]._M_node;
        iVar4 = WriteBatchInternal::Count((WriteBatch *)in_stack_ffffffffffffff68);
        if (iVar4 != 0) {
          __assert_fail("WriteBatchInternal::Count(result) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                        ,0x51d,"WriteBatch *leveldb::DBImpl::BuildBatchGroup(Writer **)");
        }
        WriteBatchInternal::Append((WriteBatch *)dst,(WriteBatch *)src);
      }
      WriteBatchInternal::Append((WriteBatch *)dst,(WriteBatch *)src);
    }
    *in_RSI = (long)src;
    std::
    _Deque_iterator<leveldb::DBImpl::Writer_*,_leveldb::DBImpl::Writer_*&,_leveldb::DBImpl::Writer_**>
    ::operator++(in_stack_ffffffffffffff68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_68;
}

Assistant:

WriteBatch* DBImpl::BuildBatchGroup(Writer** last_writer) {
  mutex_.AssertHeld();
  assert(!writers_.empty());
  Writer* first = writers_.front();
  WriteBatch* result = first->batch;
  assert(result != nullptr);

  size_t size = WriteBatchInternal::ByteSize(first->batch);

  // Allow the group to grow up to a maximum size, but if the
  // original write is small, limit the growth so we do not slow
  // down the small write too much.
  size_t max_size = 1 << 20;
  if (size <= (128 << 10)) {
    max_size = size + (128 << 10);
  }

  *last_writer = first;
  std::deque<Writer*>::iterator iter = writers_.begin();
  ++iter;  // Advance past "first"
  for (; iter != writers_.end(); ++iter) {
    Writer* w = *iter;
    if (w->sync && !first->sync) {
      // Do not include a sync write into a batch handled by a non-sync write.
      break;
    }

    if (w->batch != nullptr) {
      size += WriteBatchInternal::ByteSize(w->batch);
      if (size > max_size) {
        // Do not make batch too big
        break;
      }

      // Append to *result
      if (result == first->batch) {
        // Switch to temporary batch instead of disturbing caller's batch
        result = tmp_batch_;
        assert(WriteBatchInternal::Count(result) == 0);
        WriteBatchInternal::Append(result, first->batch);
      }
      WriteBatchInternal::Append(result, w->batch);
    }
    *last_writer = w;
  }
  return result;
}